

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biginteger.cpp
# Opt level: O2

BigInteger * __thiscall BigInteger::operator+=(BigInteger *this,BigInteger *a)

{
  uint uVar1;
  BigInteger *pBVar2;
  uint uVar3;
  compare_t cVar4;
  uint uVar5;
  ulong in_RAX;
  ulong uVar6;
  pointer puVar7;
  ulong uVar8;
  uint uVar9;
  size_t i;
  pointer puVar10;
  pointer puVar11;
  ulong uVar12;
  ulong uVar13;
  BigInteger *pBVar14;
  undefined8 local_38;
  
  local_38 = in_RAX;
  if (this->negative == a->negative) {
    puVar7 = (a->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar11 = (a->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish;
    puVar10 = (this->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
              .super__Vector_impl_data._M_start;
    uVar13 = 0;
    uVar3 = 0;
    while( true ) {
      uVar6 = (long)puVar11 - (long)puVar7 >> 2;
      uVar8 = (long)(this->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)puVar10 >> 2;
      uVar12 = uVar8;
      if (uVar8 < uVar6) {
        uVar12 = uVar6;
      }
      if ((uVar12 <= uVar13) && (uVar3 == 0)) break;
      if (uVar8 <= uVar13) {
        local_38 = local_38 & 0xffffffff;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  (&this->digits,(uint *)((long)&local_38 + 4));
        puVar10 = (this->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        puVar7 = (a->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                 .super__Vector_impl_data._M_start;
        puVar11 = (a->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        uVar6 = (long)puVar11 - (long)puVar7 >> 2;
      }
      uVar9 = 0;
      if (uVar13 < uVar6) {
        uVar9 = puVar7[uVar13];
      }
      uVar9 = uVar3 + puVar10[uVar13] + uVar9;
      uVar3 = uVar9 / 1000000000;
      puVar10[uVar13] = uVar9 % 1000000000;
      uVar13 = uVar13 + 1;
    }
  }
  else {
    cVar4 = _compareAbs(this,a);
    pBVar14 = a;
    pBVar2 = this;
    if (cVar4 < CMP_EQUAL) {
      pBVar14 = this;
      pBVar2 = a;
    }
    this->negative = pBVar2->negative;
    uVar3 = 0;
    for (uVar13 = 0;
        (uVar3 != 0 ||
        (uVar13 < (ulong)((long)(a->digits).
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)(a->digits).
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start >> 2)));
        uVar13 = uVar13 + 1) {
      if ((ulong)((long)(this->digits).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(this->digits).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start >> 2) <= uVar13) {
        local_38 = local_38 & 0xffffffff00000000;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  (&this->digits,(uint *)&local_38);
      }
      puVar10 = (pBVar14->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start;
      uVar9 = 0;
      if (uVar13 < (ulong)((long)(pBVar14->digits).
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_finish - (long)puVar10 >> 2)) {
        uVar9 = puVar10[uVar13];
      }
      uVar1 = (pBVar2->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar13];
      uVar9 = uVar9 + uVar3;
      uVar5 = (uVar1 - uVar9) + 1000000000;
      if (uVar1 >= uVar9) {
        uVar5 = uVar1 - uVar9;
      }
      uVar3 = (uint)(uVar1 < uVar9);
      (this->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[uVar13] = uVar5;
    }
  }
  normalize(this);
  return this;
}

Assistant:

BigInteger &BigInteger::operator+=(const BigInteger &a) noexcept
{
    bool sub = negative ^a.negative;
    int rem = 0;
    if(!sub)  // addition
    {
        for(size_t i = 0; i < std::max(a.digits.size(), digits.size()) || rem; ++i)
        {
            if(digits.size() <= i)
                digits.push_back(0);
            digits[i] = digits[i] + (a.digits.size() > i ? a.digits[i] : 0) + rem;
            rem = digits[i] / BLOCK_MOD;
            digits[i] %= BLOCK_MOD;
        }
    }
    else
    {
        bool rev = _compareAbs(a) < 0;
        const BigInteger &big = (rev ? a : *this), &small = (rev ? *this : a);
        negative = big.negative;
        for(size_t i = 0; i < a.digits.size() || rem; ++i)
        {
            if(digits.size() <= i)
                digits.push_back(0);
            unsigned dig = (small.digits.size() > i ? small.digits[i] : 0);
            if(big.digits[i] >= dig + rem)
            {
                digits[i] = big.digits[i] - dig - rem;
                rem = 0;
            }
            else
            {
                digits[i] = BLOCK_MOD + big.digits[i] - dig - rem;
                rem = 1;
            }
        }
    }
    normalize();
    return *this;
}